

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O1

_Bool is_rtl(wchar_t c)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = -1;
  iVar3 = 0x510;
  while( true ) {
    iVar5 = (iVar4 + iVar3) / 2;
    iVar1 = iVar5;
    if ((bidi_getType::lookup[iVar5].first <= c) &&
       (iVar4 = iVar5, iVar1 = iVar3, c <= bidi_getType::lookup[iVar5].last)) break;
    iVar3 = iVar1;
    if (iVar3 - iVar4 < 2) {
      uVar2 = 0x16;
LAB_00101f80:
      return (0x83f6U >> (uVar2 & 0x1f) & 1) != 0;
    }
  }
  uVar2 = (uint)(byte)bidi_getType::lookup[iVar5].type;
  goto LAB_00101f80;
}

Assistant:

bool is_rtl(int c)
{
    return typeIsBidiActive(bidi_getType(c));
}